

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

int co_cond_signal(stCoCond_t *si)

{
  stTimeoutItem_t *ap;
  stCoCondItem_t *psVar1;
  stTimeoutItemLink_t *psVar2;
  stTimeoutItem_t *psVar3;
  stCoCondItem_t *psVar4;
  stCoCondItem_t *lp;
  long in_FS_OFFSET;
  
  psVar1 = si->head;
  if (psVar1 != (stCoCondItem_t *)0x0) {
    if (psVar1 == si->tail) {
      si->tail = (stCoCondItem_t *)0x0;
      psVar4 = (stCoCondItem_t *)0x0;
    }
    else {
      psVar4 = psVar1->pNext;
    }
    si->head = psVar4;
    psVar1->pPrev = (stCoCondItem_t *)0x0;
    psVar1->pNext = (stCoCondItem_t *)0x0;
    psVar1->pLink = (stCoCond_t *)0x0;
    if (psVar4 != (stCoCondItem_t *)0x0) {
      psVar4->pPrev = (stCoCondItem_t *)0x0;
    }
    if (psVar1 != (stCoCondItem_t *)0x0) {
      ap = &psVar1->timeout;
      RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(ap);
      if ((psVar1->timeout).pLink == (stTimeoutItemLink_t *)0x0) {
        psVar2 = *(stTimeoutItemLink_t **)
                  (*(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x408) + 0x18);
        psVar3 = psVar2->tail;
        if (psVar3 == (stTimeoutItem_t *)0x0) {
          psVar2->tail = ap;
          psVar2->head = ap;
          ap->pPrev = (stTimeoutItem_t *)0x0;
          (psVar1->timeout).pNext = (stTimeoutItem_t *)0x0;
        }
        else {
          psVar3->pNext = ap;
          (psVar1->timeout).pNext = (stTimeoutItem_t *)0x0;
          (psVar1->timeout).pPrev = psVar3;
          psVar2->tail = ap;
        }
        (psVar1->timeout).pLink = psVar2;
      }
    }
  }
  return 0;
}

Assistant:

stCoCondItem_t *co_cond_pop( stCoCond_t *link )
{
	stCoCondItem_t *p = link->head;
	if( p )
	{
		PopHead<stCoCondItem_t,stCoCond_t>( link );
	}
	return p;
}